

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultiAgentPlanner.cpp
# Opt level: O0

vector<multi_agent_planning::Plan,_std::allocator<multi_agent_planning::Plan>_> * __thiscall
multi_agent_planning::MultiAgentPlanner::solve_best_alternative_grouping
          (vector<multi_agent_planning::Plan,_std::allocator<multi_agent_planning::Plan>_>
           *__return_storage_ptr__,MultiAgentPlanner *this,
          vector<multi_agent_planning::PlanningAgent,_std::allocator<multi_agent_planning::PlanningAgent>_>
          *agents,vector<multi_agent_planning::Instance,_std::allocator<multi_agent_planning::Instance>_>
                  *instances,Scenario *scenario,int theta)

{
  value_type vVar1;
  pointer pPVar2;
  bool bVar3;
  int iVar4;
  size_type sVar5;
  ulong uVar6;
  reference pvVar7;
  reference pvVar8;
  ostream *poVar9;
  reference piVar10;
  reference pvVar11;
  const_reference instance;
  reference this_00;
  int local_1a0;
  int cost_diff;
  int i;
  int best_diff;
  int best_alt;
  undefined1 local_170 [8];
  Plan plan;
  iterator iStack_148;
  int id_2;
  iterator __end3_1;
  iterator __begin3_1;
  vector<int,_std::allocator<int>_> *__range3_1;
  vector<int,_std::allocator<int>_> alternativeCosts;
  vector<multi_agent_planning::Plan,_std::allocator<multi_agent_planning::Plan>_> alternativePlans;
  iterator iStack_f8;
  int id_1;
  iterator __end3;
  iterator __begin3;
  vector<int,_std::allocator<int>_> *__range3;
  vector<multi_agent_planning::Plan,_std::allocator<multi_agent_planning::Plan>_> group_plans;
  vector<int,_std::allocator<int>_> *group;
  iterator __end2;
  iterator __begin2;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *__range2;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  groups;
  undefined1 local_88 [3];
  bool convergence;
  int iteration_counter;
  int local_68;
  int id;
  allocator<int> local_51;
  undefined1 local_50 [8];
  vector<int,_std::allocator<int>_> costs;
  int theta_local;
  Scenario *scenario_local;
  vector<multi_agent_planning::Instance,_std::allocator<multi_agent_planning::Instance>_>
  *instances_local;
  vector<multi_agent_planning::PlanningAgent,_std::allocator<multi_agent_planning::PlanningAgent>_>
  *agents_local;
  MultiAgentPlanner *this_local;
  vector<multi_agent_planning::Plan,_std::allocator<multi_agent_planning::Plan>_> *plans;
  
  costs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._3_1_ = 0;
  costs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = theta;
  solve_baseline(__return_storage_ptr__,this,agents,instances);
  sVar5 = std::
          vector<multi_agent_planning::PlanningAgent,_std::allocator<multi_agent_planning::PlanningAgent>_>
          ::size(agents);
  std::allocator<int>::allocator(&local_51);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_50,sVar5,&local_51);
  std::allocator<int>::~allocator(&local_51);
  for (local_68 = 0; uVar6 = (ulong)local_68,
      sVar5 = std::
              vector<multi_agent_planning::PlanningAgent,_std::allocator<multi_agent_planning::PlanningAgent>_>
              ::size(agents), uVar6 < sVar5; local_68 = local_68 + 1) {
    pvVar7 = std::vector<multi_agent_planning::Plan,_std::allocator<multi_agent_planning::Plan>_>::
             operator[](__return_storage_ptr__,(long)local_68);
    Plan::Plan((Plan *)local_88,pvVar7);
    iVar4 = evaluate_one_plan(this,__return_storage_ptr__,scenario,(Plan *)local_88,local_68);
    pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)local_50,(long)local_68);
    *pvVar8 = iVar4;
    Plan::~Plan((Plan *)local_88);
  }
  groups.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
  groups.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._3_1_ = 0;
  while ((groups.
          super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._3_1_ & 1) == 0 &&
         groups.
         super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ <
         costs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_end_of_storage._4_4_) {
    poVar9 = std::operator<<((ostream *)&std::cout,"!!!!!!!!!!!! Iteration ");
    poVar9 = (ostream *)
             std::ostream::operator<<
                       (poVar9,groups.
                               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
    poVar9 = std::operator<<(poVar9," !!!!!!!!!!!!");
    std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
    get_interacting_groups
              ((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                *)&__range2,this,__return_storage_ptr__,scenario);
    groups.
    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._3_1_ = 1;
    __end2 = std::
             vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ::begin((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                      *)&__range2);
    group = (vector<int,_std::allocator<int>_> *)
            std::
            vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            ::end((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   *)&__range2);
    while (bVar3 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<std::vector<int,_std::allocator<int>_>_*,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
                                       *)&group), bVar3) {
      group_plans.
      super__Vector_base<multi_agent_planning::Plan,_std::allocator<multi_agent_planning::Plan>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)__gnu_cxx::
                    __normal_iterator<std::vector<int,_std::allocator<int>_>_*,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
                    ::operator*(&__end2);
      std::vector<multi_agent_planning::Plan,_std::allocator<multi_agent_planning::Plan>_>::vector
                ((vector<multi_agent_planning::Plan,_std::allocator<multi_agent_planning::Plan>_> *)
                 &__range3);
      pPVar2 = group_plans.
               super__Vector_base<multi_agent_planning::Plan,_std::allocator<multi_agent_planning::Plan>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
      __end3 = std::vector<int,_std::allocator<int>_>::begin
                         ((vector<int,_std::allocator<int>_> *)
                          group_plans.
                          super__Vector_base<multi_agent_planning::Plan,_std::allocator<multi_agent_planning::Plan>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
      iStack_f8 = std::vector<int,_std::allocator<int>_>::end
                            ((vector<int,_std::allocator<int>_> *)pPVar2);
      while (bVar3 = __gnu_cxx::operator!=(&__end3,&stack0xffffffffffffff08), bVar3) {
        piVar10 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                  operator*(&__end3);
        pvVar7 = std::
                 vector<multi_agent_planning::Plan,_std::allocator<multi_agent_planning::Plan>_>::
                 operator[](__return_storage_ptr__,(long)*piVar10);
        std::vector<multi_agent_planning::Plan,_std::allocator<multi_agent_planning::Plan>_>::
        push_back((vector<multi_agent_planning::Plan,_std::allocator<multi_agent_planning::Plan>_> *
                  )&__range3,pvVar7);
        __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                  (&__end3);
      }
      std::vector<multi_agent_planning::Plan,_std::allocator<multi_agent_planning::Plan>_>::vector
                ((vector<multi_agent_planning::Plan,_std::allocator<multi_agent_planning::Plan>_> *)
                 &alternativeCosts.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)&__range3_1);
      pPVar2 = group_plans.
               super__Vector_base<multi_agent_planning::Plan,_std::allocator<multi_agent_planning::Plan>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
      __end3_1 = std::vector<int,_std::allocator<int>_>::begin
                           ((vector<int,_std::allocator<int>_> *)
                            group_plans.
                            super__Vector_base<multi_agent_planning::Plan,_std::allocator<multi_agent_planning::Plan>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
      iStack_148 = std::vector<int,_std::allocator<int>_>::end
                             ((vector<int,_std::allocator<int>_> *)pPVar2);
      while (bVar3 = __gnu_cxx::operator!=(&__end3_1,&stack0xfffffffffffffeb8), bVar3) {
        piVar10 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                  operator*(&__end3_1);
        plan._28_4_ = *piVar10;
        pvVar11 = std::
                  vector<multi_agent_planning::PlanningAgent,_std::allocator<multi_agent_planning::PlanningAgent>_>
                  ::operator[](agents,(long)(int)plan._28_4_);
        instance = std::
                   vector<multi_agent_planning::Instance,_std::allocator<multi_agent_planning::Instance>_>
                   ::operator[](instances,(long)(int)plan._28_4_);
        PlanningAgent::computeInterDependentPlan
                  ((Plan *)local_170,pvVar11,instance,scenario,
                   (vector<multi_agent_planning::Plan,_std::allocator<multi_agent_planning::Plan>_>
                    *)&__range3,1.0);
        std::vector<multi_agent_planning::Plan,_std::allocator<multi_agent_planning::Plan>_>::
        push_back((vector<multi_agent_planning::Plan,_std::allocator<multi_agent_planning::Plan>_> *
                  )&alternativeCosts.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,(value_type *)local_170);
        pvVar11 = std::
                  vector<multi_agent_planning::PlanningAgent,_std::allocator<multi_agent_planning::PlanningAgent>_>
                  ::operator[](agents,(long)(int)plan._28_4_);
        PlanningAgent::planToString_abi_cxx11_((string *)&best_alt,pvVar11,(Plan *)local_170);
        std::operator<<((ostream *)&std::cout,(string *)&best_alt);
        std::__cxx11::string::~string((string *)&best_alt);
        best_diff = (int)plan.actions.
                         super__Vector_base<multi_agent_planning::PlannedAction,_std::allocator<multi_agent_planning::PlannedAction>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_;
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)&__range3_1,&best_diff);
        Plan::~Plan((Plan *)local_170);
        __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                  (&__end3_1);
      }
      i = 0;
      cost_diff = 0;
      for (local_1a0 = 0;
          sVar5 = std::vector<int,_std::allocator<int>_>::size
                            ((vector<int,_std::allocator<int>_> *)
                             group_plans.
                             super__Vector_base<multi_agent_planning::Plan,_std::allocator<multi_agent_planning::Plan>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage),
          (ulong)(long)local_1a0 < sVar5; local_1a0 = local_1a0 + 1) {
        pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)
                            group_plans.
                            super__Vector_base<multi_agent_planning::Plan,_std::allocator<multi_agent_planning::Plan>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,(long)local_1a0);
        pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)local_50,(long)*pvVar8);
        iVar4 = *pvVar8;
        pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)&__range3_1,(long)local_1a0);
        iVar4 = iVar4 - *pvVar8;
        if (0 < iVar4) {
          groups.
          super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._3_1_ = 0;
        }
        if (cost_diff < iVar4) {
          i = local_1a0;
          cost_diff = iVar4;
        }
      }
      if ((groups.
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage._3_1_ & 1) == 0) {
        poVar9 = std::operator<<((ostream *)&std::cout,"Agent ");
        pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)
                            group_plans.
                            super__Vector_base<multi_agent_planning::Plan,_std::allocator<multi_agent_planning::Plan>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,(long)i);
        poVar9 = (ostream *)std::ostream::operator<<(poVar9,*pvVar8);
        poVar9 = std::operator<<(poVar9," wins!");
        std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
      }
      pvVar7 = std::vector<multi_agent_planning::Plan,_std::allocator<multi_agent_planning::Plan>_>
               ::operator[]((vector<multi_agent_planning::Plan,_std::allocator<multi_agent_planning::Plan>_>
                             *)&alternativeCosts.super__Vector_base<int,_std::allocator<int>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage,(long)i);
      pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)
                          group_plans.
                          super__Vector_base<multi_agent_planning::Plan,_std::allocator<multi_agent_planning::Plan>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,(long)i);
      this_00 = std::vector<multi_agent_planning::Plan,_std::allocator<multi_agent_planning::Plan>_>
                ::operator[](__return_storage_ptr__,(long)*pvVar8);
      Plan::operator=(this_00,pvVar7);
      pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)&__range3_1,(long)i);
      vVar1 = *pvVar8;
      pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)
                          group_plans.
                          super__Vector_base<multi_agent_planning::Plan,_std::allocator<multi_agent_planning::Plan>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,(long)i);
      pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)local_50,(long)*pvVar8);
      *pvVar8 = vVar1;
      std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)&__range3_1);
      std::vector<multi_agent_planning::Plan,_std::allocator<multi_agent_planning::Plan>_>::~vector
                ((vector<multi_agent_planning::Plan,_std::allocator<multi_agent_planning::Plan>_> *)
                 &alternativeCosts.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      std::vector<multi_agent_planning::Plan,_std::allocator<multi_agent_planning::Plan>_>::~vector
                ((vector<multi_agent_planning::Plan,_std::allocator<multi_agent_planning::Plan>_> *)
                 &__range3);
      __gnu_cxx::
      __normal_iterator<std::vector<int,_std::allocator<int>_>_*,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
      ::operator++(&__end2);
    }
    groups.
    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
         groups.
         super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ + 1;
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               *)&__range2);
  }
  costs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._3_1_ = 1;
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_50);
  if ((costs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage._3_1_ & 1) == 0) {
    std::vector<multi_agent_planning::Plan,_std::allocator<multi_agent_planning::Plan>_>::~vector
              (__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

vector<Plan> MultiAgentPlanner::solve_best_alternative_grouping(std::vector<PlanningAgent>& agents, 
																											const std::vector<Instance>& instances, 
																											const Scenario& scenario,
																											const int theta) {
	
	vector<Plan> plans = solve_baseline(agents, instances);

	vector<int> costs(agents.size());
	for (int id = 0; id < agents.size(); ++id) {
		costs[id] = evaluate_one_plan(plans, scenario, plans[id], id);
	}

	int iteration_counter = 1;
	bool convergence = false;

	while ((! convergence) && (iteration_counter < theta)) {
		cout << "!!!!!!!!!!!! Iteration " << iteration_counter << " !!!!!!!!!!!!" << endl;

		vector<vector<int> > groups = get_interacting_groups(plans, scenario);
		
		convergence = true;

		for (auto& group : groups) {
			
			vector<Plan> group_plans;
			for (int id : group) {
				group_plans.push_back(plans[id]);
			}

			vector<Plan> alternativePlans;
			vector<int> alternativeCosts;

			for (int id : group) {
				Plan plan = agents[id].computeInterDependentPlan(instances[id], scenario, group_plans);

				alternativePlans.push_back(plan);

				cout << agents[id].planToString(plan);

				alternativeCosts.push_back(plan.cost);
			}

			int best_alt = 0;
			int best_diff = 0;
			
			for (int i = 0; i < group.size(); ++i) {
				int cost_diff = costs[group[i]] - alternativeCosts[i];

				if (cost_diff > 0) {
					convergence = false;
				}
				
				if (cost_diff > best_diff) {
					best_diff = cost_diff;
					best_alt = i;
				}
			}

			if (! convergence) {
				cout << "Agent " << group[best_alt] << " wins!" << endl;
			}

			plans[group[best_alt]] = alternativePlans[best_alt];
			costs[group[best_alt]] = alternativeCosts[best_alt];

		}




		iteration_counter++;

	}

	return plans;
}